

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ssize_t __thiscall
kj::FileOutputStream::write(FileOutputStream *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  undefined4 in_register_00000034;
  long lVar2;
  undefined1 local_50 [8];
  ArrayPtr<const_unsigned_char> piece;
  ArrayPtr<const_unsigned_char> *__end1;
  ArrayPtr<const_unsigned_char> *__begin1;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *__range1;
  FileOutputStream *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  this_local = (FileOutputStream *)__buf;
  pieces_local.ptr = (ArrayPtr<const_unsigned_char> *)__n;
  pieces_local.size_ = (size_t)this;
  __end1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::begin
                     ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  piece.size_ = (size_t)ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::end
                                  ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local
                                  );
  for (; __end1 != (ArrayPtr<const_unsigned_char> *)piece.size_; __end1 = __end1 + 1) {
    local_50 = (undefined1  [8])__end1->ptr;
    piece.ptr = (uchar *)__end1->size_;
    (**(code **)(**(long **)(lVar2 + 8) + 0x48))
              (*(long **)(lVar2 + 8),*(undefined8 *)(lVar2 + 0x10),local_50,piece.ptr);
    sVar1 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)local_50);
    *(size_t *)(lVar2 + 0x10) = sVar1 + *(long *)(lVar2 + 0x10);
  }
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (ssize_t)this;
}

Assistant:

Promise<void> FileOutputStream::write(ArrayPtr<const ArrayPtr<const byte>> pieces) {
  // TODO(perf): Extend kj::File with an array-of-arrays write?
  for (auto piece: pieces) {
    file.write(offset, piece);
    offset += piece.size();
  }
  return kj::READY_NOW;
}